

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DefUseManager::WhileEachUse
          (DefUseManager *this,Instruction *def,
          function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> *f)

{
  bool bVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  pointer pUVar4;
  Operand *pOVar5;
  uint *puVar6;
  Operand *op;
  uint32_t idx;
  Instruction *user;
  const_iterator iter;
  iterator end;
  function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> *f_local;
  Instruction *def_local;
  DefUseManager *this_local;
  
  bVar1 = false;
  if (def != (Instruction *)0x0) {
    bVar1 = Instruction::HasResultId(def);
    if (bVar1) {
      uVar2 = Instruction::result_id(def);
      pIVar3 = GetDef(this,uVar2);
      bVar1 = false;
      if (def != pIVar3) goto LAB_0034636b;
    }
    bVar1 = true;
  }
LAB_0034636b:
  if (!bVar1) {
    __assert_fail("def && (!def->HasResultId() || def == GetDef(def->result_id())) && \"Definition is not registered.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/def_use_manager.cpp"
                  ,0x97,
                  "bool spvtools::opt::analysis::DefUseManager::WhileEachUse(const Instruction *, const std::function<bool (Instruction *, uint32_t)> &) const"
                 );
  }
  bVar1 = Instruction::HasResultId(def);
  if (bVar1) {
    iter._M_node = (_Base_ptr)
                   std::
                   set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
                   ::end(&this->id_to_users_);
    user = (Instruction *)UsersBegin(this,def);
    while (bVar1 = UsersNotEnd(this,(const_iterator *)&user,&iter,def), bVar1) {
      pUVar4 = std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>::operator->
                         ((_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry> *)&user);
      pIVar3 = pUVar4->user;
      for (op._4_4_ = 0; uVar2 = Instruction::NumOperands(pIVar3), op._4_4_ != uVar2;
          op._4_4_ = op._4_4_ + 1) {
        pOVar5 = Instruction::GetOperand(pIVar3,op._4_4_);
        if ((pOVar5->type != SPV_OPERAND_TYPE_RESULT_ID) &&
           (bVar1 = spvIsIdType(pOVar5->type), bVar1)) {
          uVar2 = Instruction::result_id(def);
          puVar6 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar5->words,0);
          if ((uVar2 == *puVar6) &&
             (bVar1 = std::function<bool_(spvtools::opt::Instruction_*,_unsigned_int)>::operator()
                                (f,pIVar3,op._4_4_), !bVar1)) {
            return false;
          }
        }
      }
      std::_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry>::operator++
                ((_Rb_tree_const_iterator<spvtools::opt::analysis::UserEntry> *)&user);
    }
  }
  return true;
}

Assistant:

bool DefUseManager::WhileEachUse(
    const Instruction* def,
    const std::function<bool(Instruction*, uint32_t)>& f) const {
  // Ensure that |def| has been registered.
  assert(def && (!def->HasResultId() || def == GetDef(def->result_id())) &&
         "Definition is not registered.");
  if (!def->HasResultId()) return true;

  auto end = id_to_users_.end();
  for (auto iter = UsersBegin(def); UsersNotEnd(iter, end, def); ++iter) {
    Instruction* user = iter->user;
    for (uint32_t idx = 0; idx != user->NumOperands(); ++idx) {
      const Operand& op = user->GetOperand(idx);
      if (op.type != SPV_OPERAND_TYPE_RESULT_ID && spvIsIdType(op.type)) {
        if (def->result_id() == op.words[0]) {
          if (!f(user, idx)) return false;
        }
      }
    }
  }
  return true;
}